

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitImplication(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
                 *this,ImplicationExpr e)

{
  ulong uVar1;
  Buffer<char> *pBVar2;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> BVar3;
  size_t sVar4;
  
  BVar3 = internal::ExprBase::Create<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    (*(Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.
                                      super_ExprBase.impl_ + 8));
  Visit(this,(LogicalExpr)BVar3.super_ExprBase.impl_,-1);
  pBVar2 = this->writer_->buffer_;
  sVar4 = pBVar2->size_;
  uVar1 = sVar4 + 5;
  if (pBVar2->capacity_ < uVar1) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
    sVar4 = pBVar2->size_;
  }
  builtin_strncpy(pBVar2->ptr_ + sVar4," ==> ",5);
  pBVar2->size_ = uVar1;
  BVar3 = internal::ExprBase::Create<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    (*(Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.
                                      super_ExprBase.impl_ + 0x10));
  Visit(this,(LogicalExpr)BVar3.super_ExprBase.impl_,4);
  BVar3 = internal::ExprBase::Create<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    (*(Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.
                                      super_ExprBase.impl_ + 0x18));
  if (((BVar3.super_ExprBase.impl_ != (Impl *)0x0) && (*(int *)BVar3.super_ExprBase.impl_ == 0x30))
     && (*(char *)((long)BVar3.super_ExprBase.impl_ + 4) != '\x01')) {
    return;
  }
  pBVar2 = this->writer_->buffer_;
  sVar4 = pBVar2->size_;
  uVar1 = sVar4 + 6;
  if (pBVar2->capacity_ < uVar1) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
    sVar4 = pBVar2->size_;
  }
  builtin_strncpy(pBVar2->ptr_ + sVar4," else ",6);
  pBVar2->size_ = uVar1;
  Visit(this,(LogicalExpr)BVar3.super_ExprBase.impl_,-1);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitImplication(ImplicationExpr e) {
  Visit(e.condition());
  writer_ << " ==> ";
  Visit(e.then_expr(), prec::IMPLICATION + 1);
  LogicalExpr else_expr = e.else_expr();
  LogicalConstant c = ExprTypes::template Cast<LogicalConstant>(else_expr);
  if (!c || c.value() != 0) {
    writer_ << " else ";
    Visit(else_expr);
  }
}